

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::RunContext::invokeActiveTestCase(RunContext *this)

{
  (this->m_fatalConditionhandler).m_started = true;
  FatalConditionHandler::engage_platform((FatalConditionHandler *)this);
  (**((this->m_activeTestCase->test).
      super___shared_ptr<Catch::ITestInvoker,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_ITestInvoker)();
  (this->m_fatalConditionhandler).m_started = false;
  restorePreviousSignalHandlers();
  return;
}

Assistant:

void RunContext::invokeActiveTestCase() {
        FatalConditionHandlerGuard _(&m_fatalConditionhandler);
        m_activeTestCase->invoke();
    }